

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O2

Builder * embree::sse2::BVH4Triangle4SceneBuilderSAH(void *bvh,Scene *scene,size_t mode)

{
  BVHNBuilderSAH<4,_embree::TriangleM<4>_> *this;
  
  this = (BVHNBuilderSAH<4,_embree::TriangleM<4>_> *)::operator_new(0xa8);
  BVHNBuilderSAH<4,_embree::TriangleM<4>_>::BVHNBuilderSAH
            (this,(BVH *)bvh,scene,4,1.0,4,0xffffffffffffffff,MTY_TRIANGLE_MESH,false);
  return &this->super_Builder;
}

Assistant:

Builder* BVH4Triangle4SceneBuilderSAH  (void* bvh, Scene* scene, size_t mode) { return new BVHNBuilderSAH<4,Triangle4>((BVH4*)bvh,scene,4,1.0f,4,inf,TriangleMesh::geom_type); }